

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O1

void test_arithm<unsigned_long>
               (uint length,unsigned_long value1,unsigned_long value2,bool allowTrash)

{
  bool bVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  long lVar4;
  _func_int **pp_Var5;
  long lVar6;
  long lVar7;
  _func_int **pp_Var8;
  long lVar9;
  _func_int **pp_Var10;
  long lVar11;
  _func_int **pp_Var12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var21;
  undefined8 *puVar22;
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var23;
  int iVar24;
  int iVar25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var27;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  shared_ptr<unsigned_long> pv1;
  shared_ptr<unsigned_long> pv2;
  shared_ptr<unsigned_long> presult;
  
  presult.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       (undefined4)CONCAT71(in_register_00000009,allowTrash);
  lVar16 = (long)(int)length;
  iVar15 = posix_memalign(&pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi,0x10,lVar16 * 8);
  local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar15 == 0) {
    local_78 = pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_long*,void(*)(unsigned_long*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1,local_78,
             sse::common::free<unsigned_long>);
  iVar15 = posix_memalign(&pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi,0x10,lVar16 * 8);
  pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar15 == 0) {
    pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
         pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_long*,void(*)(unsigned_long*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2,
             pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             sse::common::free<unsigned_long>);
  iVar15 = posix_memalign(&local_80,0x10,(long)(int)(length + 1) << 3);
  if (iVar15 != 0) {
    local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_80;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_long*,void(*)(unsigned_long*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult,local_80,
             sse::common::free<unsigned_long>);
  uVar14 = (ulong)length;
  (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base)[uVar14] = (_func_int **)0x7f;
  _Var26._M_use_count = (int)value1;
  _Var26._vptr__Sp_counted_base = (_func_int **)value1;
  _Var26._M_weak_count = (_Atomic_word)(value1 >> 0x20);
  iVar25 = (int)length >> 1;
  p_Var17 = local_78;
  iVar24 = iVar25;
  iVar15 = iVar25;
  if (3 < iVar25) {
    do {
      *p_Var17 = _Var26;
      p_Var17[1] = _Var26;
      p_Var17[2] = _Var26;
      p_Var17[3] = _Var26;
      iVar15 = iVar24 + -4;
      p_Var17 = p_Var17 + 4;
      bVar1 = 7 < iVar24;
      iVar24 = iVar15;
    } while (bVar1);
  }
  if (1 < iVar15) {
    *p_Var17 = _Var26;
    p_Var17[1] = _Var26;
    iVar15 = iVar15 + -2;
    p_Var17 = p_Var17 + 2;
  }
  if (iVar15 != 0) {
    *p_Var17 = _Var26;
  }
  if (length != 0) {
    *(unsigned_long *)((long)local_78 + lVar16 * 8 + -8) = value1;
  }
  _Var27._M_use_count = (int)value2;
  _Var27._vptr__Sp_counted_base = (_func_int **)value2;
  _Var27._M_weak_count = (_Atomic_word)(value2 >> 0x20);
  _Var21 = pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  iVar24 = iVar25;
  iVar15 = iVar25;
  if (3 < iVar25) {
    do {
      *_Var21._M_pi = _Var27;
      _Var21._M_pi[1] = _Var27;
      _Var21._M_pi[2] = _Var27;
      _Var21._M_pi[3] = _Var27;
      iVar15 = iVar24 + -4;
      _Var21._M_pi = _Var21._M_pi + 4;
      bVar1 = 7 < iVar24;
      iVar24 = iVar15;
    } while (bVar1);
  }
  if (1 < iVar15) {
    *_Var21._M_pi = _Var27;
    _Var21._M_pi[1] = _Var27;
    iVar15 = iVar15 + -2;
    _Var21._M_pi = _Var21._M_pi + 2;
  }
  if (iVar15 != 0) {
    *_Var21._M_pi = _Var27;
  }
  if (length != 0) {
    *(unsigned_long *)
     ((long)pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
     lVar16 * 8 + -8) = value2;
    lVar18 = 0;
    do {
      if (((&local_78->_vptr__Sp_counted_base)[lVar18] != (_func_int **)value1) ||
         ((&(pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar18] != (_func_int **)value2)) {
        puVar22 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar22 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar22 + 1) = 0x1a;
        *(uint *)((long)puVar22 + 0xc) = length;
        __cxa_throw(puVar22,&Exception::typeinfo,0);
      }
      lVar18 = lVar18 + 1;
    } while (length != (uint)lVar18);
  }
  _Var21._M_pi = pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  p_Var17 = local_78;
  _Var23 = pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  iVar15 = iVar25;
  iVar24 = iVar25;
  if (3 < iVar25) {
    do {
      lVar18 = *(long *)&(_Var23._M_pi)->_M_use_count;
      pp_Var2 = _Var23._M_pi[1]._vptr__Sp_counted_base;
      lVar20 = *(long *)&_Var23._M_pi[1]._M_use_count;
      pp_Var3 = _Var23._M_pi[2]._vptr__Sp_counted_base;
      lVar4 = *(long *)&_Var23._M_pi[2]._M_use_count;
      pp_Var5 = _Var23._M_pi[3]._vptr__Sp_counted_base;
      lVar6 = *(long *)&_Var23._M_pi[3]._M_use_count;
      lVar7 = *(long *)&p_Var17->_M_use_count;
      pp_Var8 = p_Var17[1]._vptr__Sp_counted_base;
      lVar9 = *(long *)&p_Var17[1]._M_use_count;
      pp_Var10 = p_Var17[2]._vptr__Sp_counted_base;
      lVar11 = *(long *)&p_Var17[2]._M_use_count;
      pp_Var12 = p_Var17[3]._vptr__Sp_counted_base;
      lVar13 = *(long *)&p_Var17[3]._M_use_count;
      (_Var21._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)
           ((long)(_Var23._M_pi)->_vptr__Sp_counted_base + (long)p_Var17->_vptr__Sp_counted_base);
      *(long *)&(_Var21._M_pi)->_M_use_count = lVar18 + lVar7;
      _Var21._M_pi[1]._vptr__Sp_counted_base = (_func_int **)((long)pp_Var2 + (long)pp_Var8);
      *(long *)&_Var21._M_pi[1]._M_use_count = lVar20 + lVar9;
      _Var21._M_pi[2]._vptr__Sp_counted_base = (_func_int **)((long)pp_Var3 + (long)pp_Var10);
      *(long *)&_Var21._M_pi[2]._M_use_count = lVar4 + lVar11;
      _Var21._M_pi[3]._vptr__Sp_counted_base = (_func_int **)((long)pp_Var5 + (long)pp_Var12);
      *(long *)&_Var21._M_pi[3]._M_use_count = lVar6 + lVar13;
      iVar15 = iVar24 + -4;
      p_Var17 = p_Var17 + 4;
      _Var23._M_pi = _Var23._M_pi + 4;
      _Var21._M_pi = _Var21._M_pi + 4;
      bVar1 = 7 < iVar24;
      iVar24 = iVar15;
    } while (bVar1);
  }
  if (1 < iVar15) {
    lVar18 = *(long *)&(_Var23._M_pi)->_M_use_count;
    lVar20 = *(long *)&p_Var17->_M_use_count;
    (_Var21._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)
         ((long)(_Var23._M_pi)->_vptr__Sp_counted_base + (long)p_Var17->_vptr__Sp_counted_base);
    *(long *)&(_Var21._M_pi)->_M_use_count = lVar18 + lVar20;
    lVar18 = *(long *)&_Var23._M_pi[1]._M_use_count;
    lVar20 = *(long *)&p_Var17[1]._M_use_count;
    _Var21._M_pi[1]._vptr__Sp_counted_base =
         (_func_int **)
         ((long)_Var23._M_pi[1]._vptr__Sp_counted_base + (long)p_Var17[1]._vptr__Sp_counted_base);
    *(long *)&_Var21._M_pi[1]._M_use_count = lVar18 + lVar20;
    iVar15 = iVar15 + -2;
    p_Var17 = p_Var17 + 2;
    _Var23._M_pi = _Var23._M_pi + 2;
    _Var21._M_pi = _Var21._M_pi + 2;
  }
  if (iVar15 != 0) {
    lVar18 = *(long *)&(_Var23._M_pi)->_M_use_count;
    lVar20 = *(long *)&p_Var17->_M_use_count;
    (_Var21._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)
         ((long)(_Var23._M_pi)->_vptr__Sp_counted_base + (long)p_Var17->_vptr__Sp_counted_base);
    *(long *)&(_Var21._M_pi)->_M_use_count = lVar18 + lVar20;
  }
  if (length != 0) {
    *(long *)((long)pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi + lVar16 * 8 + -8) =
         *(long *)((long)pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + lVar16 * 8 + -8) +
         *(long *)((long)local_78 + lVar16 * 8 + -8);
  }
  if (length != 0) {
    lVar18 = 0;
    do {
      if ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar18] != (_func_int **)(value2 + value1)) {
        puVar22 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar22 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar22 + 1) = 0x22;
        *(uint *)((long)puVar22 + 0xc) = length;
        __cxa_throw(puVar22,&Exception::typeinfo,0);
      }
      lVar18 = lVar18 + 1;
    } while (length != (uint)lVar18);
  }
  _Var21._M_pi = pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  _Var23 = pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  p_Var17 = local_78;
  iVar15 = iVar25;
  iVar24 = iVar25;
  if (3 < iVar25) {
    do {
      lVar18 = *(long *)&p_Var17->_M_use_count;
      pp_Var2 = p_Var17[1]._vptr__Sp_counted_base;
      lVar20 = *(long *)&p_Var17[1]._M_use_count;
      pp_Var3 = p_Var17[2]._vptr__Sp_counted_base;
      lVar4 = *(long *)&p_Var17[2]._M_use_count;
      pp_Var5 = p_Var17[3]._vptr__Sp_counted_base;
      lVar6 = *(long *)&p_Var17[3]._M_use_count;
      lVar7 = *(long *)&(_Var23._M_pi)->_M_use_count;
      pp_Var8 = _Var23._M_pi[1]._vptr__Sp_counted_base;
      lVar9 = *(long *)&_Var23._M_pi[1]._M_use_count;
      pp_Var10 = _Var23._M_pi[2]._vptr__Sp_counted_base;
      lVar11 = *(long *)&_Var23._M_pi[2]._M_use_count;
      pp_Var12 = _Var23._M_pi[3]._vptr__Sp_counted_base;
      lVar13 = *(long *)&_Var23._M_pi[3]._M_use_count;
      (_Var21._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)
           ((long)p_Var17->_vptr__Sp_counted_base - (long)(_Var23._M_pi)->_vptr__Sp_counted_base);
      *(long *)&(_Var21._M_pi)->_M_use_count = lVar18 - lVar7;
      _Var21._M_pi[1]._vptr__Sp_counted_base = (_func_int **)((long)pp_Var2 - (long)pp_Var8);
      *(long *)&_Var21._M_pi[1]._M_use_count = lVar20 - lVar9;
      _Var21._M_pi[2]._vptr__Sp_counted_base = (_func_int **)((long)pp_Var3 - (long)pp_Var10);
      *(long *)&_Var21._M_pi[2]._M_use_count = lVar4 - lVar11;
      _Var21._M_pi[3]._vptr__Sp_counted_base = (_func_int **)((long)pp_Var5 - (long)pp_Var12);
      *(long *)&_Var21._M_pi[3]._M_use_count = lVar6 - lVar13;
      iVar15 = iVar24 + -4;
      p_Var17 = p_Var17 + 4;
      _Var23._M_pi = _Var23._M_pi + 4;
      _Var21._M_pi = _Var21._M_pi + 4;
      bVar1 = 7 < iVar24;
      iVar24 = iVar15;
    } while (bVar1);
  }
  if (1 < iVar15) {
    lVar18 = *(long *)&p_Var17->_M_use_count;
    lVar20 = *(long *)&(_Var23._M_pi)->_M_use_count;
    (_Var21._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)
         ((long)p_Var17->_vptr__Sp_counted_base - (long)(_Var23._M_pi)->_vptr__Sp_counted_base);
    *(long *)&(_Var21._M_pi)->_M_use_count = lVar18 - lVar20;
    lVar18 = *(long *)&p_Var17[1]._M_use_count;
    lVar20 = *(long *)&_Var23._M_pi[1]._M_use_count;
    _Var21._M_pi[1]._vptr__Sp_counted_base =
         (_func_int **)
         ((long)p_Var17[1]._vptr__Sp_counted_base - (long)_Var23._M_pi[1]._vptr__Sp_counted_base);
    *(long *)&_Var21._M_pi[1]._M_use_count = lVar18 - lVar20;
    iVar15 = iVar15 + -2;
    p_Var17 = p_Var17 + 2;
    _Var23._M_pi = _Var23._M_pi + 2;
    _Var21._M_pi = _Var21._M_pi + 2;
  }
  if (iVar15 != 0) {
    lVar18 = *(long *)&p_Var17->_M_use_count;
    lVar20 = *(long *)&(_Var23._M_pi)->_M_use_count;
    (_Var21._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)
         ((long)p_Var17->_vptr__Sp_counted_base - (long)(_Var23._M_pi)->_vptr__Sp_counted_base);
    *(long *)&(_Var21._M_pi)->_M_use_count = lVar18 - lVar20;
  }
  if (length != 0) {
    *(long *)((long)pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi + lVar16 * 8 + -8) =
         *(long *)((long)local_78 + lVar16 * 8 + -8) -
         *(long *)((long)pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + lVar16 * 8 + -8);
  }
  if (length != 0) {
    lVar18 = 0;
    do {
      if ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar18] != (_func_int **)(value1 - value2)) {
        puVar22 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar22 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar22 + 1) = 0x2a;
        *(uint *)((long)puVar22 + 0xc) = length;
        __cxa_throw(puVar22,&Exception::typeinfo,0);
      }
      lVar18 = lVar18 + 1;
    } while (length != (uint)lVar18);
  }
  if (local_78 ==
      pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar19 = 0;
      do {
        (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar19] =
             (_func_int **)
             ((long)(&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi)->_vptr__Sp_counted_base)[uVar19] *
             (long)(&(pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_vptr__Sp_counted_base)[uVar19]);
        uVar19 = uVar19 + 1;
      } while (uVar14 != uVar19);
    }
  }
  else if (pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
           pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar19 = 0;
      do {
        (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar19] =
             (_func_int **)
             ((long)(&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi)->_vptr__Sp_counted_base)[uVar19] *
             (long)(&local_78->_vptr__Sp_counted_base)[uVar19]);
        uVar19 = uVar19 + 1;
      } while (uVar14 != uVar19);
    }
  }
  else if (0 < (int)length) {
    uVar19 = 0;
    do {
      (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar19] =
           (_func_int **)
           ((long)(&(pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)->_vptr__Sp_counted_base)[uVar19] *
           (long)(&local_78->_vptr__Sp_counted_base)[uVar19]);
      uVar19 = uVar19 + 1;
    } while (uVar14 != uVar19);
  }
  if (length != 0) {
    lVar18 = 0;
    do {
      if ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar18] != (_func_int **)(value2 * value1)) {
        puVar22 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar22 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar22 + 1) = 0x32;
        *(uint *)((long)puVar22 + 0xc) = length;
        __cxa_throw(puVar22,&Exception::typeinfo,0);
      }
      lVar18 = lVar18 + 1;
    } while (length != (uint)lVar18);
  }
  if (local_78 ==
      pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar19 = 0;
      do {
        (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar19] =
             (_func_int **)
             ((ulong)(&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar19] /
             (ulong)(&(pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi)->_vptr__Sp_counted_base)[uVar19]);
        uVar19 = uVar19 + 1;
      } while (uVar14 != uVar19);
    }
  }
  else if (0 < (int)length) {
    uVar19 = 0;
    do {
      (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar19] =
           (_func_int **)
           ((ulong)(&local_78->_vptr__Sp_counted_base)[uVar19] /
           (ulong)(&(pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)->_vptr__Sp_counted_base)[uVar19]);
      uVar19 = uVar19 + 1;
    } while (uVar14 != uVar19);
  }
  if (length != 0) {
    lVar18 = 0;
    do {
      if ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar18] != (_func_int **)(value1 / value2)) {
        puVar22 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar22 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar22 + 1) = 0x3a;
        *(uint *)((long)puVar22 + 0xc) = length;
        __cxa_throw(puVar22,&Exception::typeinfo,0);
      }
      lVar18 = lVar18 + 1;
    } while (length != (uint)lVar18);
  }
  lVar18 = _Var27._8_8_;
  _Var21._M_pi = pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  p_Var17 = local_78;
  iVar24 = iVar25;
  iVar15 = iVar25;
  if (3 < iVar25) {
    do {
      lVar20 = *(long *)&p_Var17->_M_use_count;
      (_Var21._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)((long)p_Var17->_vptr__Sp_counted_base + value2);
      *(long *)&(_Var21._M_pi)->_M_use_count = lVar20 + lVar18;
      lVar20 = *(long *)&p_Var17[1]._M_use_count;
      _Var21._M_pi[1]._vptr__Sp_counted_base =
           (_func_int **)((long)p_Var17[1]._vptr__Sp_counted_base + value2);
      *(long *)&_Var21._M_pi[1]._M_use_count = lVar20 + lVar18;
      lVar20 = *(long *)&p_Var17[2]._M_use_count;
      _Var21._M_pi[2]._vptr__Sp_counted_base =
           (_func_int **)((long)p_Var17[2]._vptr__Sp_counted_base + value2);
      *(long *)&_Var21._M_pi[2]._M_use_count = lVar20 + lVar18;
      lVar20 = *(long *)&p_Var17[3]._M_use_count;
      _Var21._M_pi[3]._vptr__Sp_counted_base =
           (_func_int **)((long)p_Var17[3]._vptr__Sp_counted_base + value2);
      *(long *)&_Var21._M_pi[3]._M_use_count = lVar20 + lVar18;
      iVar15 = iVar24 + -4;
      p_Var17 = p_Var17 + 4;
      _Var21._M_pi = _Var21._M_pi + 4;
      bVar1 = 7 < iVar24;
      iVar24 = iVar15;
    } while (bVar1);
  }
  if (1 < iVar15) {
    lVar20 = *(long *)&p_Var17->_M_use_count;
    (_Var21._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)((long)p_Var17->_vptr__Sp_counted_base + value2);
    *(long *)&(_Var21._M_pi)->_M_use_count = lVar20 + lVar18;
    lVar20 = *(long *)&p_Var17[1]._M_use_count;
    _Var21._M_pi[1]._vptr__Sp_counted_base =
         (_func_int **)((long)p_Var17[1]._vptr__Sp_counted_base + value2);
    *(long *)&_Var21._M_pi[1]._M_use_count = lVar20 + lVar18;
    iVar15 = iVar15 + -2;
    p_Var17 = p_Var17 + 2;
    _Var21._M_pi = _Var21._M_pi + 2;
  }
  if (iVar15 != 0) {
    lVar20 = *(long *)&p_Var17->_M_use_count;
    (_Var21._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)((long)p_Var17->_vptr__Sp_counted_base + value2);
    *(long *)&(_Var21._M_pi)->_M_use_count = lVar20 + lVar18;
  }
  if (length != 0) {
    *(unsigned_long *)
     ((long)pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
     lVar16 * 8 + -8) = *(long *)((long)local_78 + lVar16 * 8 + -8) + value2;
    lVar20 = 0;
    do {
      if ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar20] != (_func_int **)(value2 + value1)) {
        puVar22 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar22 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar22 + 1) = 0x43;
        *(uint *)((long)puVar22 + 0xc) = length;
        __cxa_throw(puVar22,&Exception::typeinfo,0);
      }
      lVar20 = lVar20 + 1;
    } while (length != (uint)lVar20);
  }
  _Var21._M_pi = pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  p_Var17 = local_78;
  iVar24 = iVar25;
  iVar15 = iVar25;
  if (3 < iVar25) {
    do {
      lVar20 = *(long *)&p_Var17->_M_use_count;
      (_Var21._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)((long)p_Var17->_vptr__Sp_counted_base - value2);
      *(long *)&(_Var21._M_pi)->_M_use_count = lVar20 - lVar18;
      lVar20 = *(long *)&p_Var17[1]._M_use_count;
      _Var21._M_pi[1]._vptr__Sp_counted_base =
           (_func_int **)((long)p_Var17[1]._vptr__Sp_counted_base - value2);
      *(long *)&_Var21._M_pi[1]._M_use_count = lVar20 - lVar18;
      lVar20 = *(long *)&p_Var17[2]._M_use_count;
      _Var21._M_pi[2]._vptr__Sp_counted_base =
           (_func_int **)((long)p_Var17[2]._vptr__Sp_counted_base - value2);
      *(long *)&_Var21._M_pi[2]._M_use_count = lVar20 - lVar18;
      lVar20 = *(long *)&p_Var17[3]._M_use_count;
      _Var21._M_pi[3]._vptr__Sp_counted_base =
           (_func_int **)((long)p_Var17[3]._vptr__Sp_counted_base - value2);
      *(long *)&_Var21._M_pi[3]._M_use_count = lVar20 - lVar18;
      iVar15 = iVar24 + -4;
      p_Var17 = p_Var17 + 4;
      _Var21._M_pi = _Var21._M_pi + 4;
      bVar1 = 7 < iVar24;
      iVar24 = iVar15;
    } while (bVar1);
  }
  if (1 < iVar15) {
    lVar20 = *(long *)&p_Var17->_M_use_count;
    (_Var21._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)((long)p_Var17->_vptr__Sp_counted_base - value2);
    *(long *)&(_Var21._M_pi)->_M_use_count = lVar20 - lVar18;
    lVar20 = *(long *)&p_Var17[1]._M_use_count;
    _Var21._M_pi[1]._vptr__Sp_counted_base =
         (_func_int **)((long)p_Var17[1]._vptr__Sp_counted_base - value2);
    *(long *)&_Var21._M_pi[1]._M_use_count = lVar20 - lVar18;
    iVar15 = iVar15 + -2;
    p_Var17 = p_Var17 + 2;
    _Var21._M_pi = _Var21._M_pi + 2;
  }
  if (iVar15 != 0) {
    lVar20 = *(long *)&p_Var17->_M_use_count;
    (_Var21._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)((long)p_Var17->_vptr__Sp_counted_base - value2);
    *(long *)&(_Var21._M_pi)->_M_use_count = lVar20 - lVar18;
  }
  if (length != 0) {
    *(unsigned_long *)
     ((long)pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
     lVar16 * 8 + -8) = *(long *)((long)local_78 + lVar16 * 8 + -8) - value2;
    lVar20 = 0;
    do {
      if ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar20] != (_func_int **)(value1 - value2)) {
        puVar22 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar22 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar22 + 1) = 0x4b;
        *(uint *)((long)puVar22 + 0xc) = length;
        __cxa_throw(puVar22,&Exception::typeinfo,0);
      }
      lVar20 = lVar20 + 1;
    } while (length != (uint)lVar20);
  }
  _Var21._M_pi = pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  p_Var17 = local_78;
  iVar15 = iVar25;
  if (3 < iVar25) {
    do {
      lVar20 = *(long *)&p_Var17->_M_use_count;
      (_Var21._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)(value2 - (long)p_Var17->_vptr__Sp_counted_base);
      *(long *)&(_Var21._M_pi)->_M_use_count = lVar18 - lVar20;
      lVar20 = *(long *)&p_Var17[1]._M_use_count;
      _Var21._M_pi[1]._vptr__Sp_counted_base =
           (_func_int **)(value2 - (long)p_Var17[1]._vptr__Sp_counted_base);
      *(long *)&_Var21._M_pi[1]._M_use_count = lVar18 - lVar20;
      lVar20 = *(long *)&p_Var17[2]._M_use_count;
      _Var21._M_pi[2]._vptr__Sp_counted_base =
           (_func_int **)(value2 - (long)p_Var17[2]._vptr__Sp_counted_base);
      *(long *)&_Var21._M_pi[2]._M_use_count = lVar18 - lVar20;
      lVar20 = *(long *)&p_Var17[3]._M_use_count;
      _Var21._M_pi[3]._vptr__Sp_counted_base =
           (_func_int **)(value2 - (long)p_Var17[3]._vptr__Sp_counted_base);
      *(long *)&_Var21._M_pi[3]._M_use_count = lVar18 - lVar20;
      iVar15 = iVar25 + -4;
      p_Var17 = p_Var17 + 4;
      _Var21._M_pi = _Var21._M_pi + 4;
      bVar1 = 7 < iVar25;
      iVar25 = iVar15;
    } while (bVar1);
  }
  if (1 < iVar15) {
    lVar20 = *(long *)&p_Var17->_M_use_count;
    (_Var21._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)(value2 - (long)p_Var17->_vptr__Sp_counted_base);
    *(long *)&(_Var21._M_pi)->_M_use_count = lVar18 - lVar20;
    lVar20 = *(long *)&p_Var17[1]._M_use_count;
    _Var21._M_pi[1]._vptr__Sp_counted_base =
         (_func_int **)(value2 - (long)p_Var17[1]._vptr__Sp_counted_base);
    *(long *)&_Var21._M_pi[1]._M_use_count = lVar18 - lVar20;
    iVar15 = iVar15 + -2;
    p_Var17 = p_Var17 + 2;
    _Var21._M_pi = _Var21._M_pi + 2;
  }
  if (iVar15 != 0) {
    lVar20 = *(long *)&p_Var17->_M_use_count;
    (_Var21._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)(value2 - (long)p_Var17->_vptr__Sp_counted_base);
    *(long *)&(_Var21._M_pi)->_M_use_count = lVar18 - lVar20;
  }
  if (length != 0) {
    *(unsigned_long *)
     ((long)pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
     lVar16 * 8 + -8) = value2 - *(long *)((long)local_78 + lVar16 * 8 + -8);
    lVar16 = 0;
    do {
      if ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar16] != (_func_int **)(value2 - value1)) {
        puVar22 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar22 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar22 + 1) = 0x53;
        *(uint *)((long)puVar22 + 0xc) = length;
        __cxa_throw(puVar22,&Exception::typeinfo,0);
      }
      lVar16 = lVar16 + 1;
    } while (length != (uint)lVar16);
  }
  if (local_78 ==
      pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar19 = 0;
      do {
        (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar19] =
             (_func_int **)
             ((long)(&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi)->_vptr__Sp_counted_base)[uVar19] * value2);
        uVar19 = uVar19 + 1;
      } while (uVar14 != uVar19);
    }
  }
  else if (0 < (int)length) {
    uVar19 = 0;
    do {
      (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar19] =
           (_func_int **)((long)(&local_78->_vptr__Sp_counted_base)[uVar19] * value2);
      uVar19 = uVar19 + 1;
    } while (uVar14 != uVar19);
  }
  if (length != 0) {
    lVar16 = 0;
    do {
      if ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar16] != (_func_int **)(value2 * value1)) {
        puVar22 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar22 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar22 + 1) = 0x5b;
        *(uint *)((long)puVar22 + 0xc) = length;
        __cxa_throw(puVar22,&Exception::typeinfo,0);
      }
      lVar16 = lVar16 + 1;
    } while (length != (uint)lVar16);
  }
  if (local_78 ==
      pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar19 = 0;
      do {
        (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar19] =
             (_func_int **)
             ((ulong)(&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar19] / value2);
        uVar19 = uVar19 + 1;
      } while (uVar14 != uVar19);
    }
  }
  else if (0 < (int)length) {
    uVar19 = 0;
    do {
      (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar19] =
           (_func_int **)((ulong)(&local_78->_vptr__Sp_counted_base)[uVar19] / value2);
      uVar19 = uVar19 + 1;
    } while (uVar14 != uVar19);
  }
  if (length != 0) {
    lVar16 = 0;
    do {
      if ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar16] != (_func_int **)(value1 / value2)) {
        puVar22 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar22 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar22 + 1) = 99;
        *(uint *)((long)puVar22 + 0xc) = length;
        __cxa_throw(puVar22,&Exception::typeinfo,0);
      }
      lVar16 = lVar16 + 1;
    } while (length != (uint)lVar16);
  }
  if (0 < (int)length) {
    uVar19 = 0;
    do {
      (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar19] =
           (_func_int **)(value2 / (ulong)(&local_78->_vptr__Sp_counted_base)[uVar19]);
      uVar19 = uVar19 + 1;
    } while (uVar14 != uVar19);
  }
  if (length != 0) {
    lVar16 = 0;
    do {
      if ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar16] != (_func_int **)(value2 / value1)) {
        puVar22 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar22 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar22 + 1) = 0x6b;
        *(uint *)((long)puVar22 + 0xc) = length;
        __cxa_throw(puVar22,&Exception::typeinfo,0);
      }
      lVar16 = lVar16 + 1;
    } while (length != (uint)lVar16);
  }
  if ((presult.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_1_
       == '\0') &&
     ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar14] != (_func_int **)0x7f)) {
    puVar22 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar22 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
    *(undefined4 *)(puVar22 + 1) = 0x70;
    *(uint *)((long)puVar22 + 0xc) = length;
    __cxa_throw(puVar22,&Exception::typeinfo,0);
  }
  if (presult.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               presult.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}